

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test::TestBody
          (CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *this)

{
  uint32_t uVar1;
  undefined4 uVar2;
  CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *this_00;
  int iVar3;
  GMM_RESOURCE_INFO *pGVar4;
  uint32_t i;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  uint uStack_160;
  uint uStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ulong local_120;
  uint64_t SliceTileOffset;
  ulong local_110;
  ulong local_108;
  uint local_fc;
  uint local_f8;
  uint32_t SliceY;
  uint32_t Mip1RenderAlignedOffset;
  uint32_t Mip2RenderAlignedOffset;
  uint32_t Mip3RenderAlignedOffset;
  uint32_t Mip4RenderAlignedOffset;
  ulong local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  unsigned_long uStack_a8;
  uint local_a0 [12];
  undefined8 local_70;
  uint local_64;
  GMM_RESOURCE_INFO *local_60;
  ulong local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  AssertionResult gtest_ar;
  
  uStack_130 = 0;
  local_178 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_128 = 0;
  local_1a0 = 0x14500000002;
  local_138 = 0x100000000;
  local_190 = 0x400000000;
  local_198 = 0x20000000;
  uStack_160 = 0;
  uStack_15c = 6;
  uStack_170 = 4;
  local_168 = 4;
  pGVar4 = (GMM_RESOURCE_INFO *)
           (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                     (CommonULT::pGmmULTClientContext,&local_1a0);
  CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar4,8);
  local_70 = this;
  local_60 = pGVar4;
  CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar4,8);
  pGVar4 = local_60;
  this_00 = local_70;
  uVar8 = (int)uStack_170 + 7U & 0xfffffff8;
  local_64 = (int)local_168 + 7;
  uVar13 = local_64 & 0xfffffff8;
  local_e0 = 0;
  uVar5 = 1;
  uVar15 = 0;
  uVar7 = 0;
  uVar9 = 0;
  while( true ) {
    uVar6 = (uint)uVar7;
    if (uStack_160 < uVar5) break;
    uVar10 = uVar8 >> ((byte)uVar5 & 0x1f);
    uVar11 = uVar10 + 7 + (uint)(uVar10 == 0) & 0xfffffff8;
    uVar10 = uVar13 >> ((byte)uVar5 & 0x1f);
    uVar10 = uVar10 + 7 + (uint)(uVar10 == 0) & 0xfffffff8;
    if (uVar5 == 1) {
      uVar7 = (ulong)uVar11;
      local_e0 = uVar7;
    }
    else if (uVar5 == 2) {
      uVar7 = (ulong)(uVar6 + uVar11);
      uVar15 = uVar10;
      uVar10 = uVar9;
    }
    else {
      uVar15 = uVar15 + uVar10;
      uVar10 = uVar9;
    }
    uVar5 = uVar5 + 1;
    uVar9 = uVar10;
  }
  if (uVar15 < uVar9) {
    uVar15 = uVar9;
  }
  uVar15 = uVar15 + uVar13;
  if (uVar8 < uVar6) {
    uVar8 = uVar6;
  }
  uVar5 = uVar8 + 0x3f & 0xffffffc0;
  local_58 = (ulong)uVar5;
  CTestResource::VerifyResourcePitch<true>((CTestResource *)local_70,local_60,uVar5 * 2);
  CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this_00,pGVar4,uVar8 + 0x3f >> 6)
  ;
  iVar14 = (int)local_58;
  Mip4RenderAlignedOffset = iVar14 * uVar15;
  CTestResource::VerifyResourceSize<true>
            ((CTestResource *)this_00,pGVar4,
             (ulong)(uStack_15c * Mip4RenderAlignedOffset + 0xfff & 0xfffff000));
  SliceTileOffset = (ulong)uVar15;
  CTestResource::VerifyResourceQPitch<true>((CTestResource *)this_00,pGVar4,(ulong)uVar15);
  local_108 = (ulong)(iVar14 * uVar13);
  iVar3 = ((uVar13 >> 2) + 7 & 0xfffffff8) + uVar13;
  local_110 = (ulong)(uint)(iVar14 * iVar3 + (int)local_e0);
  local_64 = (((local_64 >> 3) + 7 & 0xfffffff8) + iVar3) * iVar14 + (int)local_e0;
  uVar5 = 0;
  while( true ) {
    uVar15 = uVar5 & 0xff;
    if ((uStack_15c <= uVar15) || (uStack_160 < 4)) break;
    local_a0[4] = 0;
    local_a0[5] = 0;
    local_a0[6] = 0;
    local_a0[7] = 0;
    local_a0[0] = 0;
    local_a0[1] = 0;
    local_a0[2] = 0;
    local_a0[3] = 0;
    local_b0 = 0;
    uStack_a8 = 0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    local_a0[8] = 0;
    local_a0[9] = 0;
    uStack_d0 = 0;
    uStack_c8 = 0;
    local_d8 = CONCAT44(uVar5,1) & 0xffffffffff;
    (**(code **)(*(long *)local_60 + 0x68))(local_60,&local_d8);
    local_fc = (int)SliceTileOffset * uVar15;
    local_120 = (ulong)((local_fc & 0xffffffc0) << 6);
    local_fc = local_fc & 0x3f;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_40,"SliceTileOffset","ReqInfo.Render.Offset64",&local_120,&uStack_a8);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x664,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_50.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"0","ReqInfo.Render.XOffset",(int *)&local_50,local_a0);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x665,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_40,"SliceY","ReqInfo.Render.YOffset",&local_fc,local_a0 + 1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x666,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    iVar14 = Mip4RenderAlignedOffset * uVar15;
    Mip3RenderAlignedOffset = uVar5;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uStack_c8 = 0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0[0] = 0;
    local_a0[1] = 0;
    local_a0[2] = 0;
    local_a0[3] = 0;
    local_a0[4] = 0;
    local_a0[5] = 0;
    local_a0[6] = 0;
    local_a0[7] = 0;
    local_a0[8] = 0;
    local_a0[9] = 0;
    uStack_d0 = 1;
    local_70 = (CTestGen9Resource_Test2DStencilArrayedCpuBltResource_Test *)
               (CONCAT44(local_70._4_4_,uVar5) & 0xffffffff000000ff);
    local_d8 = CONCAT44(uVar5,1) & 0xffffffffff;
    (**(code **)(*(long *)local_60 + 0x68))(local_60,&local_d8);
    uVar5 = (int)local_108 + iVar14;
    uVar15 = uVar5 / (uint)local_58;
    uVar5 = uVar5 % (uint)local_58;
    local_50.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"0","ReqInfo.Render.XOffset",(int *)&local_50,local_a0);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x671,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_50.ptr_._0_4_ = uVar15 & 0x3f;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_40,"Mip1Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&local_50,
               local_a0 + 1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x672,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_f8 = uVar5 * 0x40 + (uVar15 & 0xffffffc0) * (uint)local_58;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_40,"Mip1RenderAlignedOffset","ReqInfo.Render.Offset64",&local_f8,&uStack_a8);
    uVar2 = (undefined4)local_70;
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x676,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uStack_c8 = 0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0[0] = 0;
    local_a0[1] = 0;
    local_a0[2] = 0;
    local_a0[3] = 0;
    local_a0[4] = 0;
    local_a0[5] = 0;
    local_a0[6] = 0;
    local_a0[7] = 0;
    local_a0[8] = 0;
    local_a0[9] = 0;
    uStack_d0 = 2;
    local_d8 = CONCAT44(uVar2,1);
    (**(code **)(*(long *)local_60 + 0x68))(local_60,&local_d8);
    uVar5 = (int)local_e0 + iVar14 + (int)local_108;
    uVar15 = uVar5 / (uint)local_58;
    uVar5 = uVar5 % (uint)local_58;
    local_50.ptr_._0_4_ = 8;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"8","ReqInfo.Render.XOffset",(int *)&local_50,local_a0);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x682,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_50.ptr_._0_4_ = uVar15 & 0x3f;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_40,"Mip2Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&local_50,
               local_a0 + 1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x683,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    SliceY = (uVar5 & 0xffffffc0) * 0x40 + (uVar15 & 0xffffffc0) * (uint)local_58;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_40,"Mip2RenderAlignedOffset","ReqInfo.Render.Offset64",&SliceY,&uStack_a8);
    uVar2 = (undefined4)local_70;
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x687,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uStack_c8 = 0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0[0] = 0;
    local_a0[1] = 0;
    local_a0[2] = 0;
    local_a0[3] = 0;
    local_a0[4] = 0;
    local_a0[5] = 0;
    local_a0[6] = 0;
    local_a0[7] = 0;
    local_a0[8] = 0;
    local_a0[9] = 0;
    uStack_d0 = 3;
    local_d8 = CONCAT44(uVar2,1);
    (**(code **)(*(long *)local_60 + 0x68))(local_60,&local_d8);
    uVar5 = (int)local_110 + iVar14;
    uVar15 = uVar5 / (uint)local_58;
    uVar5 = uVar5 % (uint)local_58;
    local_50.ptr_._0_4_ = 8;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"8","ReqInfo.Render.XOffset",(int *)&local_50,local_a0);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x693,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_50.ptr_._0_4_ = uVar15 & 0x3f;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_40,"Mip3Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&local_50,
               local_a0 + 1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x694,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    Mip1RenderAlignedOffset = (uVar5 & 0xffffffc0) * 0x40 + (uVar15 & 0xffffffc0) * (uint)local_58;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_40,"Mip3RenderAlignedOffset","ReqInfo.Render.Offset64",&Mip1RenderAlignedOffset
               ,&uStack_a8);
    uVar2 = (undefined4)local_70;
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x698,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uStack_c8 = 0;
    uStack_c0 = 0;
    uStack_b8 = 0;
    local_b0 = 0;
    uStack_a8 = 0;
    local_a0[0] = 0;
    local_a0[1] = 0;
    local_a0[2] = 0;
    local_a0[3] = 0;
    local_a0[4] = 0;
    local_a0[5] = 0;
    local_a0[6] = 0;
    local_a0[7] = 0;
    local_a0[8] = 0;
    local_a0[9] = 0;
    uStack_d0 = 4;
    local_d8 = CONCAT44(uVar2,1);
    (**(code **)(*(long *)local_60 + 0x68))(local_60,&local_d8);
    uVar5 = (iVar14 + local_64) / (uint)local_58;
    uVar15 = (iVar14 + local_64) % (uint)local_58;
    local_50.ptr_._0_4_ = 8;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_40,"8","ReqInfo.Render.XOffset",(int *)&local_50,local_a0);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x6a4,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    local_50.ptr_._0_4_ = uVar5 & 0x3f;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_40,"Mip4Y % TileSize[1]","ReqInfo.Render.YOffset",(uint *)&local_50,
               local_a0 + 1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x6a5,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    Mip2RenderAlignedOffset = (uVar15 & 0xffffffc0) * 0x40 + (uVar5 & 0xffffffc0) * (uint)local_58;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_40,"Mip4RenderAlignedOffset","ReqInfo.Render.Offset64",&Mip2RenderAlignedOffset
               ,&uStack_a8);
    uVar1 = Mip3RenderAlignedOffset;
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar12 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar12 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x6a9,pcVar12);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_50);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uVar5 = CONCAT31((int3)(uVar1 >> 8),(char)uVar1 + '\x01');
  }
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,local_60);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DStencilArrayedCpuBltResource)
{
    const uint32_t HAlign = {8};
    const uint32_t VAlign = {8};

    const uint32_t TileSize[2] = {64, 64}; //TileW

    GMM_RESCREATE_PARAMS gmmParams      = {};
    gmmParams.Type                      = RESOURCE_2D;
    gmmParams.NoGfxMemory               = 1;
    gmmParams.Flags.Info.TiledW         = 1;
    gmmParams.Flags.Gpu.SeparateStencil = 1;
    gmmParams.MaxLod                    = 0;
    gmmParams.ArraySize                 = 6;

    {
        uint32_t AlignedWidth  = 0;
        uint32_t AlignedHeight = 0;
        uint32_t ExpectedPitch = 0;
        // Valigned Mip Heights
        uint32_t Mip0Height = 0;
        uint32_t Mip1Height = 0;
        uint32_t Mip2Height = 0;

        // Haligned Mip Widths
        uint32_t Mip0Width = 0;
        uint32_t Mip1Width = 0;
        uint32_t Mip2Width = 0;

        TEST_BPP bpp          = TEST_BPP_8;
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x4;
        gmmParams.BaseHeight  = 0x4;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);

        // Mip resource Aligned Width calculation
        Mip0Width  = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        Mip0Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);

        for(uint32_t i = 1; i <= gmmParams.MaxLod; i++)
        {
            uint32_t MipWidth  = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Width >> i, 1), HAlign);
            uint32_t MipHeight = GMM_ULT_ALIGN(GMM_ULT_MAX(Mip0Height >> i, 1), VAlign);
            if(i == 1)
            {
                Mip1Width = AlignedWidth = MipWidth;
                Mip1Height               = MipHeight;
            }
            else if(i == 2)
            {
                AlignedWidth += MipWidth;
                Mip2Height = MipHeight;
            }
            else
            {
                Mip2Height += MipHeight;
            }
        }

        uint32_t MaxHeight = GMM_ULT_MAX(Mip1Height, Mip2Height);
        AlignedHeight      = Mip0Height + MaxHeight;

        ExpectedPitch = GMM_ULT_MAX(AlignedWidth, Mip0Width) * GetBppValue(bpp);
        ExpectedPitch = GMM_ULT_ALIGN(ExpectedPitch, TileSize[0]);
        //TileW is programmed as row-interleaved.. ie doubled pitch
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch * 2);

        VerifyResourcePitchInTiles<true>(ResourceInfo, static_cast<uint32_t>(ExpectedPitch / TileSize[0]));
        VerifyResourceSize<true>(ResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * AlignedHeight * gmmParams.ArraySize, PAGE_SIZE));
        VerifyResourceQPitch<true>(ResourceInfo, AlignedHeight);

        for(uint8_t i = 0; i < gmmParams.ArraySize && gmmParams.MaxLod >= 4; i++)
        {
            uint64_t ArrayOffset = AlignedHeight * ExpectedPitch * i;

            // Mip 0 offsets, offset is 0,0
            GMM_REQ_OFFSET_INFO ReqInfo = {0};
            ReqInfo.MipLevel            = 0;
            ReqInfo.ReqRender           = 1;
            ReqInfo.ArrayIndex          = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip0Size        = ExpectedPitch * Mip0Height;
            uint64_t SliceTileOffset = GFX_ALIGN_FLOOR(AlignedHeight * i, TileSize[1]) * TileSize[0];
            uint32_t SliceY          = (AlignedHeight * i) % TileSize[1];
            EXPECT_EQ(SliceTileOffset, ReqInfo.Render.Offset64);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(SliceY, ReqInfo.Render.YOffset);

            // Mip 1 offsets
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 1;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip1Offset = Mip0Size + ArrayOffset;
            uint32_t Mip1X      = uint32_t(Mip1Offset % ExpectedPitch);
            uint32_t Mip1Y      = uint32_t(Mip1Offset / ExpectedPitch);
            EXPECT_EQ(0, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip1Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip1X                            = GFX_ALIGN_FLOOR(Mip1X, TileSize[0]);
            Mip1Y                            = GFX_ALIGN_FLOOR(Mip1Y, TileSize[1]);
            uint32_t Mip1RenderAlignedOffset = Mip1Y * ExpectedPitch + (Mip1X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip1RenderAlignedOffset, ReqInfo.Render.Offset64);


            // Mip 2 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 2;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip2Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch + ArrayOffset;
            uint32_t Mip2X      = uint32_t(Mip2Offset % ExpectedPitch);
            uint32_t Mip2Y      = uint32_t(Mip2Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip2Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip2X                            = GFX_ALIGN_FLOOR(Mip2X, TileSize[0]);
            Mip2Y                            = GFX_ALIGN_FLOOR(Mip2Y, TileSize[1]);
            uint32_t Mip2RenderAlignedOffset = Mip2Y * ExpectedPitch + (Mip2X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip2RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 3 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 3;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);

            uint32_t Mip3Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip3X      = uint32_t(Mip3Offset % ExpectedPitch);
            uint32_t Mip3Y      = uint32_t(Mip3Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip3Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip3X                            = GFX_ALIGN_FLOOR(Mip3X, TileSize[0]);
            Mip3Y                            = GFX_ALIGN_FLOOR(Mip3Y, TileSize[1]);
            uint32_t Mip3RenderAlignedOffset = Mip3Y * ExpectedPitch + (Mip3X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip3RenderAlignedOffset, ReqInfo.Render.Offset64);

            // Mip 4 offset
            ReqInfo            = {0};
            ReqInfo.MipLevel   = 4;
            ReqInfo.ReqRender  = 1;
            ReqInfo.ArrayIndex = i;
            ResourceInfo->GetOffset(ReqInfo);
            uint32_t Mip4Offset = 0;
            Mip4Offset          = Mip1Width * GetBppValue(bpp) + (Mip0Height + GMM_ULT_ALIGN(Mip0Height >> 2, VAlign) + GMM_ULT_ALIGN(Mip0Height >> 3, VAlign)) * ExpectedPitch + ArrayOffset;
            uint32_t Mip4X      = uint32_t(Mip4Offset % ExpectedPitch);
            uint32_t Mip4Y      = uint32_t(Mip4Offset / ExpectedPitch);
            EXPECT_EQ(8, ReqInfo.Render.XOffset);
            EXPECT_EQ(Mip4Y % TileSize[1], ReqInfo.Render.YOffset);
            Mip4X                            = GFX_ALIGN_FLOOR(Mip4X, TileSize[0]);
            Mip4Y                            = GFX_ALIGN_FLOOR(Mip4Y, TileSize[1]);
            uint32_t Mip4RenderAlignedOffset = Mip4Y * ExpectedPitch + (Mip4X / TileSize[0]) * (TileSize[0] * TileSize[1]);
            EXPECT_EQ(Mip4RenderAlignedOffset, ReqInfo.Render.Offset64);
        }

        //Verify CpuBlt path (uses Render offset for upload)
        {
#ifdef _WIN32
#define ULT_ALIGNED_MALLOC(Size, alignBytes) _aligned_malloc(Size, alignBytes)
#define ULT_ALIGNED_FREE(ptr) _aligned_free(ptr)
#else
#define ULT_ALIGNED_MALLOC(Size, alignBytes) memalign(alignBytes, Size)
#define ULT_ALIGNED_FREE(ptr) free(ptr)
#endif

#ifdef _WIN32
            void *LockVA = ULT_ALIGNED_MALLOC(ResourceInfo->GetSizeSurface(), ResourceInfo->GetBaseAlignment());
            memset(LockVA, 0, ResourceInfo->GetSizeSurface());
            void *Sysmem = malloc(gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            memset(Sysmem, 0xbb, gmmParams.BaseWidth64 * gmmParams.BaseHeight);
            //Test Upload
            GMM_RES_COPY_BLT Blt  = {0};
            Blt.Gpu.pData         = LockVA;
            Blt.Gpu.Slice         = 4;
            Blt.Gpu.MipLevel      = 0;
            Blt.Sys.BufferSize    = gmmParams.BaseWidth64 * gmmParams.BaseHeight;
            Blt.Sys.pData         = Sysmem;
            Blt.Sys.RowPitch      = gmmParams.BaseWidth64;
            Blt.Sys.PixelPitch    = 1;
            Blt.Sys.SlicePitch    = Blt.Sys.BufferSize;
            Blt.Blt.Upload        = 1;
            Blt.Blt.BytesPerPixel = 1;
            ResourceInfo->CpuBlt(&Blt);

            uint64_t Offset = 0x100; /*Blt.Gpu.Slice * ResourceInfo->GetQPitchInBytes();*/ // Need SwizzledOffset
            for(uint8_t byte = 0; byte < Blt.Sys.BufferSize; byte++)
            {
                uint8_t *Byte = ((uint8_t *)LockVA) + Offset + byte;
                EXPECT_EQ(Byte[0], 0xbb);
            }

            free(Sysmem);
            ULT_ALIGNED_FREE(LockVA);
#endif
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}